

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O1

void __thiscall QProcessPrivate::processFinished(QProcessPrivate *this)

{
  QObject *sender;
  EVP_PKEY_CTX *in_RSI;
  long in_FS_OFFSET;
  uint local_40;
  int local_3c;
  QString local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  sender = (this->super_QIODevicePrivate).super_QObjectPrivate.super_QObjectData.q_ptr;
  waitForDeadChild(this);
  cleanup(this,in_RSI);
  if (this->exitStatus == '\x01') {
    local_38.d.d = (Data *)0x0;
    local_38.d.ptr = (char16_t *)0x0;
    local_38.d.size = 0;
    setErrorAndEmit(this,Crashed,&local_38);
    if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  QIODevice::readChannelFinished((QIODevice *)sender);
  local_3c = this->exitCode;
  local_38.d.ptr = (char16_t *)&local_3c;
  local_38.d.size = (qsizetype)&local_40;
  local_40 = (uint)this->exitStatus;
  local_38.d.d = (Data *)0x0;
  QMetaObject::activate(sender,&QProcess::staticMetaObject,1,(void **)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QProcessPrivate::processFinished()
{
    Q_Q(QProcess);
#if defined QPROCESS_DEBUG
    qDebug("QProcessPrivate::processFinished()");
#endif

#ifdef Q_OS_UNIX
    waitForDeadChild();
#else
    findExitCode();
#endif

    cleanup();

    if (exitStatus == QProcess::CrashExit)
        setErrorAndEmit(QProcess::Crashed);

    // we received EOF now:
    emit q->readChannelFinished();
    // in the future:
    //emit q->standardOutputClosed();
    //emit q->standardErrorClosed();

    emit q->finished(exitCode, QProcess::ExitStatus(exitStatus));

#if defined QPROCESS_DEBUG
    qDebug("QProcessPrivate::processFinished(): process is dead");
#endif
}